

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int nodeReaderNext(NodeReader *p)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t __n;
  int iVar6;
  long lVar7;
  int nSuffix;
  int nPrefix;
  int rc;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar3 = (p->term).n;
  local_30 = 0;
  local_34 = 0;
  local_2c = 0;
  if (p->iChild != 0 && iVar3 != 0) {
    p->iChild = p->iChild + 1;
  }
  iVar4 = p->nNode;
  iVar6 = p->iOff;
  if (iVar6 < iVar4) {
    pcVar2 = p->aNode;
    if (iVar3 != 0) {
      if (pcVar2[iVar6] < '\0') {
        iVar3 = sqlite3Fts3GetVarint32(pcVar2 + iVar6,&local_30);
      }
      else {
        iVar3 = 1;
        local_30 = (int)pcVar2[iVar6];
      }
      iVar6 = iVar6 + iVar3;
      p->iOff = iVar6;
    }
    if (pcVar2[iVar6] < '\0') {
      iVar3 = sqlite3Fts3GetVarint32(pcVar2 + iVar6,&local_34);
    }
    else {
      iVar3 = 1;
      local_34 = (int)pcVar2[iVar6];
    }
    iVar3 = iVar3 + iVar6;
    p->iOff = iVar3;
    lVar7 = (long)local_30;
    if (iVar3 < local_30) {
      return 0x10b;
    }
    __n = (size_t)local_34;
    if (iVar4 - iVar3 < local_34) {
      return 0x10b;
    }
    iVar3 = local_30 + local_34;
    blobGrowBuffer(&p->term,iVar3,&local_2c);
    if (local_2c != 0) {
      return local_2c;
    }
    memcpy((p->term).a + lVar7,p->aNode + p->iOff,__n);
    (p->term).n = iVar3;
    uVar5 = (long)p->iOff + __n;
    p->iOff = (int)uVar5;
    if (p->iChild != 0) {
      return 0;
    }
    cVar1 = p->aNode[uVar5];
    iVar3 = (int)cVar1;
    if (cVar1 < '\0') {
      iVar4 = sqlite3Fts3GetVarint32(p->aNode + uVar5,&p->nDoclist);
      uVar5 = (ulong)(uint)p->iOff;
      iVar3 = p->nDoclist;
    }
    else {
      p->nDoclist = iVar3;
      iVar4 = 1;
    }
    iVar4 = (int)uVar5 + iVar4;
    p->iOff = iVar4;
    if (p->nNode - iVar4 < iVar3) {
      return 0x10b;
    }
    p->aDoclist = p->aNode + iVar4;
    p->iOff = iVar3 + iVar4;
  }
  else {
    p->aNode = (char *)0x0;
  }
  return 0;
}

Assistant:

static int nodeReaderNext(NodeReader *p){
  int bFirst = (p->term.n==0);    /* True for first term on the node */
  int nPrefix = 0;                /* Bytes to copy from previous term */
  int nSuffix = 0;                /* Bytes to append to the prefix */
  int rc = SQLITE_OK;             /* Return code */

  assert( p->aNode );
  if( p->iChild && bFirst==0 ) p->iChild++;
  if( p->iOff>=p->nNode ){
    /* EOF */
    p->aNode = 0;
  }else{
    if( bFirst==0 ){
      p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nPrefix);
    }
    p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nSuffix);

    if( nPrefix>p->iOff || nSuffix>p->nNode-p->iOff ){
      return FTS_CORRUPT_VTAB;
    }
    blobGrowBuffer(&p->term, nPrefix+nSuffix, &rc);
    if( rc==SQLITE_OK ){
      memcpy(&p->term.a[nPrefix], &p->aNode[p->iOff], nSuffix);
      p->term.n = nPrefix+nSuffix;
      p->iOff += nSuffix;
      if( p->iChild==0 ){
        p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &p->nDoclist);
        if( (p->nNode-p->iOff)<p->nDoclist ){
          return FTS_CORRUPT_VTAB;
        }
        p->aDoclist = &p->aNode[p->iOff];
        p->iOff += p->nDoclist;
      }
    }
  }

  assert( p->iOff<=p->nNode );
  return rc;
}